

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t FSE_buildDTable(FSE_DTable *dt,short *normalizedCounter,uint maxSymbolValue,uint tableLog)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  ulong uVar5;
  U32 nextState;
  int iStack_264;
  BYTE symbol;
  U32 u;
  int i;
  U32 position;
  U32 s_1;
  U32 step;
  U32 tableMask;
  U32 s;
  uint uStack_244;
  S16 largeLimit;
  FSE_DTableHeader DTableH;
  U32 highThreshold;
  U32 tableSize;
  U32 maxSV1;
  U16 symbolNext [256];
  FSE_decode_t *tableDecode;
  void *tdPtr;
  uint tableLog_local;
  uint maxSymbolValue_local;
  short *normalizedCounter_local;
  FSE_DTable *dt_local;
  
  symbolNext._504_8_ = dt + 1;
  bVar4 = (byte)tableLog;
  uVar2 = 1 << (bVar4 & 0x1f);
  uStack_244 = uVar2 - 1;
  if (maxSymbolValue < 0x100) {
    if (tableLog < 0xd) {
      s = CONCAT22(1,(short)tableLog);
      for (step = 0; step < maxSymbolValue + 1; step = step + 1) {
        if (normalizedCounter[step] == -1) {
          *(char *)(symbolNext._504_8_ + 2 + (ulong)uStack_244 * 4) = (char)step;
          *(undefined2 *)((long)&tableSize + (ulong)step * 2) = 1;
          uStack_244 = uStack_244 - 1;
        }
        else {
          if ((short)(1 << (bVar4 - 1 & 0x1f)) <= normalizedCounter[step]) {
            s = s & 0xffff;
          }
          *(short *)((long)&tableSize + (ulong)step * 2) = normalizedCounter[step];
        }
      }
      *dt = s;
      u = 0;
      for (i = 0; (uint)i < maxSymbolValue + 1; i = i + 1) {
        for (iStack_264 = 0; iStack_264 < normalizedCounter[(uint)i]; iStack_264 = iStack_264 + 1) {
          *(char *)(symbolNext._504_8_ + 2 + (ulong)u * 4) = (char)i;
          do {
            u = u + (uVar2 >> 1) + (uVar2 >> 3) + 3 & uVar2 - 1;
          } while (uStack_244 < u);
        }
      }
      if (u == 0) {
        for (nextState = 0; nextState < uVar2; nextState = nextState + 1) {
          uVar5 = (ulong)*(byte *)(symbolNext._504_8_ + 2 + (ulong)nextState * 4);
          uVar1 = *(ushort *)((long)&tableSize + uVar5 * 2);
          *(ushort *)((long)&tableSize + uVar5 * 2) = uVar1 + 1;
          uVar3 = BIT_highbit32((uint)uVar1);
          *(byte *)(symbolNext._504_8_ + 3 + (ulong)nextState * 4) = bVar4 - (char)uVar3;
          *(ushort *)(symbolNext._504_8_ + (ulong)nextState * 4) =
               (uVar1 << (*(byte *)(symbolNext._504_8_ + 3 + (ulong)nextState * 4) & 0x1f)) -
               (short)uVar2;
        }
        dt_local = (FSE_DTable *)0x0;
      }
      else {
        dt_local = (FSE_DTable *)0xffffffffffffffff;
      }
    }
    else {
      dt_local = (FSE_DTable *)0xffffffffffffffd4;
    }
  }
  else {
    dt_local = (FSE_DTable *)0xffffffffffffffd2;
  }
  return (size_t)dt_local;
}

Assistant:

size_t FSE_buildDTable(FSE_DTable* dt, const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog)
{
    void* const tdPtr = dt+1;   /* because *dt is unsigned, 32-bits aligned on 32-bits */
    FSE_DECODE_TYPE* const tableDecode = (FSE_DECODE_TYPE*) (tdPtr);
    U16 symbolNext[FSE_MAX_SYMBOL_VALUE+1];

    U32 const maxSV1 = maxSymbolValue + 1;
    U32 const tableSize = 1 << tableLog;
    U32 highThreshold = tableSize-1;

    /* Sanity Checks */
    if (maxSymbolValue > FSE_MAX_SYMBOL_VALUE) return ERROR(maxSymbolValue_tooLarge);
    if (tableLog > FSE_MAX_TABLELOG) return ERROR(tableLog_tooLarge);

    /* Init, lay down lowprob symbols */
    {   FSE_DTableHeader DTableH;
        DTableH.tableLog = (U16)tableLog;
        DTableH.fastMode = 1;
        {   S16 const largeLimit= (S16)(1 << (tableLog-1));
            U32 s;
            for (s=0; s<maxSV1; s++) {
                if (normalizedCounter[s]==-1) {
                    tableDecode[highThreshold--].symbol = (FSE_FUNCTION_TYPE)s;
                    symbolNext[s] = 1;
                } else {
                    if (normalizedCounter[s] >= largeLimit) DTableH.fastMode=0;
                    symbolNext[s] = normalizedCounter[s];
        }   }   }
        memcpy(dt, &DTableH, sizeof(DTableH));
    }

    /* Spread symbols */
    {   U32 const tableMask = tableSize-1;
        U32 const step = FSE_TABLESTEP(tableSize);
        U32 s, position = 0;
        for (s=0; s<maxSV1; s++) {
            int i;
            for (i=0; i<normalizedCounter[s]; i++) {
                tableDecode[position].symbol = (FSE_FUNCTION_TYPE)s;
                position = (position + step) & tableMask;
                while (position > highThreshold) position = (position + step) & tableMask;   /* lowprob area */
        }   }
        if (position!=0) return ERROR(GENERIC);   /* position must reach all cells once, otherwise normalizedCounter is incorrect */
    }

    /* Build Decoding table */
    {   U32 u;
        for (u=0; u<tableSize; u++) {
            FSE_FUNCTION_TYPE const symbol = (FSE_FUNCTION_TYPE)(tableDecode[u].symbol);
            U32 const nextState = symbolNext[symbol]++;
            tableDecode[u].nbBits = (BYTE) (tableLog - BIT_highbit32(nextState) );
            tableDecode[u].newState = (U16) ( (nextState << tableDecode[u].nbBits) - tableSize);
    }   }

    return 0;
}